

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O3

ParameterError str2num(long *val,char *str)

{
  long lVar1;
  size_t sVar2;
  ParameterError PVar3;
  char *endptr;
  char *local_30;
  
  PVar3 = PARAM_BAD_NUMERIC;
  if (str != (char *)0x0) {
    lVar1 = strtol(str,&local_30,10);
    if (local_30 != str) {
      sVar2 = strlen(str);
      if (local_30 == str + sVar2) {
        *val = lVar1;
        PVar3 = PARAM_OK;
      }
    }
  }
  return PVar3;
}

Assistant:

ParameterError str2num(long *val, const char *str)
{
  if(str) {
    char *endptr;
    long num = strtol(str, &endptr, 10);
    if((endptr != str) && (endptr == str + strlen(str))) {
      *val = num;
      return PARAM_OK;  /* Ok */
    }
  }
  return PARAM_BAD_NUMERIC; /* badness */
}